

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_math.c
# Opt level: O0

int lj_cf_math_randomseed(lua_State *L)

{
  ulong uVar1;
  lua_Number d;
  PRNGState *rs;
  lua_State *L_local;
  
  uVar1 = *(ulong *)((L->base[-2].u64 & 0x7fffffffffff) + 0x30);
  d = lj_lib_checknum(L,1);
  random_seed((PRNGState *)((uVar1 & 0x7fffffffffff) + 0x30),d);
  return 0;
}

Assistant:

LJLIB_CF(math_randomseed)
{
  PRNGState *rs = (PRNGState *)(uddata(udataV(lj_lib_upvalue(L, 1))));
  random_seed(rs, lj_lib_checknum(L, 1));
  return 0;
}